

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorTimer.h
# Opt level: O0

void __thiscall
FactorTimer::reportFactorLevel0Clock(FactorTimer *this,HighsTimerClock *factor_timer_clock)

{
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  HighsTimerClock *in_stack_00000010;
  char *in_stack_00000018;
  FactorTimer *in_stack_00000020;
  vector<int,_std::allocator<int>_> factor_clock_list;
  vector<int,_std::allocator<int>_> *this_00;
  allocator_type *in_stack_ffffffffffffff98;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  initializer_list<int> in_stack_ffffffffffffffa8;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  uVar1 = 0;
  uVar2 = 0x26;
  uVar3 = 5;
  uVar4 = 0x19;
  this_00 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffb7;
  std::allocator<int>::allocator((allocator<int> *)0x7b9276);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffff98);
  std::allocator<int>::~allocator((allocator<int> *)0x7b929b);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar4,uVar3),
             (vector<int,_std::allocator<int>_> *)CONCAT44(uVar2,uVar1));
  reportFactorClockList(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  return;
}

Assistant:

void reportFactorLevel0Clock(HighsTimerClock& factor_timer_clock) {
    std::vector<HighsInt> factor_clock_list{FactorInvert, FactorReinvert,
                                            FactorFtran, FactorBtran};
    reportFactorClockList("FactorLevel0", factor_timer_clock,
                          factor_clock_list);
  }